

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void declaration(ch_compilation *comp)

{
  _Bool _Var1;
  ch_token name;
  ch_token cStack_28;
  
  _Var1 = consume(comp,TK_ID,"Expected variable name.",&cStack_28);
  if (_Var1) {
    _Var1 = consume(comp,TK_EQ,"Expected variable initializer.",(ch_token *)0x0);
    if (_Var1) {
      parse(comp,PREC_ASSIGNMENT);
    }
    add_variable(comp,cStack_28.lexeme);
  }
  return;
}

Assistant:

void declaration(ch_compilation *comp) {
  ch_token name;
  if (!consume(comp, TK_ID, "Expected variable name.", &name))
    return;

  /*
    We still want the variable to be registered even if the user forgot its initializer.
    That way, it won't cause another error where the variable is said not to exist even if it was declared.
  */
  if(consume(comp, TK_EQ, "Expected variable initializer.", NULL)) {
    expression(comp);
  }

  add_variable(comp, name.lexeme);
}